

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

void __thiscall
cmCTestRunTest::cmCTestRunTest(cmCTestRunTest *this,cmCTestMultiProcessHandler *multiHandler)

{
  _Rb_tree_header *p_Var1;
  cmCTest *pcVar2;
  
  this->TimeoutIsForStopTime = false;
  (this->TestProcess)._M_t.super___uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>._M_t.
  super__Tuple_impl<0UL,_cmProcess_*,_std::default_delete<cmProcess>_>.
  super__Head_base<0UL,_cmProcess_*,_false>._M_head_impl = (cmProcess *)0x0;
  (this->ProcessOutput)._M_dataplus._M_p = (pointer)&(this->ProcessOutput).field_2;
  (this->ProcessOutput)._M_string_length = 0;
  (this->ProcessOutput).field_2._M_local_buf[0] = '\0';
  cmCTestTestHandler::cmCTestTestResult::cmCTestTestResult(&this->TestResult);
  this->MultiTestHandler = multiHandler;
  (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  p_Var1 = &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->StartTime)._M_dataplus._M_p = (pointer)&(this->StartTime).field_2;
  (this->StartTime)._M_string_length = 0;
  (this->StartTime).field_2._M_local_buf[0] = '\0';
  (this->ActualCommand)._M_dataplus._M_p = (pointer)&(this->ActualCommand).field_2;
  (this->ActualCommand)._M_string_length = 0;
  (this->ActualCommand).field_2._M_local_buf[0] = '\0';
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Arguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->AllocatedResources).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->AllocatedResources).
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->AllocatedResources).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->AllocatedResources).
           super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->NumberOfRunsLeft = 1;
  this->NumberOfRunsTotal = 1;
  this->RunAgain = false;
  pcVar2 = multiHandler->CTest;
  this->TestHandler = multiHandler->TestHandler;
  this->CTest = pcVar2;
  (this->TestResult).TestCount = 0;
  (this->TestResult).Properties = (cmCTestTestProperties *)0x0;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).ReturnValue = 0;
  (this->TestResult).Status = 0;
  return;
}

Assistant:

cmCTestRunTest::cmCTestRunTest(cmCTestMultiProcessHandler& multiHandler)
  : MultiTestHandler(multiHandler)
{
  this->CTest = multiHandler.CTest;
  this->TestHandler = multiHandler.TestHandler;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.ReturnValue = 0;
  this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
  this->TestResult.TestCount = 0;
  this->TestResult.Properties = nullptr;
}